

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::thread_resource_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::thread_resource_error>_>
           *this,error_info_injector<boost::thread_resource_error> *x)

{
  *(undefined ***)&this->field_0x68 = &PTR___cxa_pure_virtual_001e2098;
  error_info_injector<boost::thread_resource_error>::error_info_injector
            (&this->super_error_info_injector<boost::thread_resource_error>,x);
  *(undefined8 *)
   &(this->super_error_info_injector<boost::thread_resource_error>).super_thread_resource_error.
    super_thread_exception.super_system_error = 0x1e32f0;
  (this->super_error_info_injector<boost::thread_resource_error>).super_exception._vptr_exception =
       (_func_int **)0x1e3328;
  *(undefined8 *)&this->field_0x68 = 0x1e3360;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::thread_resource_error>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }